

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_pgroup(Integer g_a,Integer p_handle)

{
  long in_RSI;
  long in_RDI;
  Integer ga_handle;
  Integer in_stack_00000188;
  char *in_stack_00000190;
  
  if (GA[in_RDI + 1000].actv == 1) {
    pnga_error(in_stack_00000190,in_stack_00000188);
  }
  if ((in_RSI == GA_World_Proc_Group) || (PGRP_LIST[in_RSI].actv == 1)) {
    GA[in_RDI + 1000].p_handle = (int)in_RSI;
  }
  else {
    pnga_error(in_stack_00000190,in_stack_00000188);
  }
  return;
}

Assistant:

void pnga_set_pgroup(Integer g_a, Integer p_handle)
{
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set processor configuration on array that has been allocated",0);
  if (p_handle == GA_World_Proc_Group || PGRP_LIST[p_handle].actv == 1) {
    GA[ga_handle].p_handle = (int) (p_handle);
  } else {
    pnga_error("Processor group does not exist",0);
  }
}